

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SGDOptimizer * __thiscall CoreML::Specification::Optimizer::mutable_sgdoptimizer(Optimizer *this)

{
  bool bVar1;
  SGDOptimizer *this_00;
  Optimizer *this_local;
  
  bVar1 = has_sgdoptimizer(this);
  if (!bVar1) {
    clear_OptimizerType(this);
    set_has_sgdoptimizer(this);
    this_00 = (SGDOptimizer *)operator_new(0x30);
    SGDOptimizer::SGDOptimizer(this_00);
    (this->OptimizerType_).sgdoptimizer_ = this_00;
  }
  return (this->OptimizerType_).sgdoptimizer_;
}

Assistant:

inline ::CoreML::Specification::SGDOptimizer* Optimizer::mutable_sgdoptimizer() {
  if (!has_sgdoptimizer()) {
    clear_OptimizerType();
    set_has_sgdoptimizer();
    OptimizerType_.sgdoptimizer_ = new ::CoreML::Specification::SGDOptimizer;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Optimizer.sgdOptimizer)
  return OptimizerType_.sgdoptimizer_;
}